

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O2

unsigned_short QIntC::IntConverter<int,_unsigned_short,_true,_false>::convert(int *i)

{
  uint i_00;
  
  i_00 = *i;
  if (0xffff < i_00) {
    error(i_00);
    i_00 = *i;
  }
  return (unsigned_short)i_00;
}

Assistant:

inline static To
        convert(From const& i)
        {
            // From is signed, and To is unsigned. If i > 0, it's safe to
            // convert it to the corresponding unsigned type and to
            // compare with To's max.
            auto ii = static_cast<typename to_u<From>::type>(i);
            if ((i < 0) || (ii > std::numeric_limits<To>::max())) {
                error(i);
            }
            return static_cast<To>(i);
        }